

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

Message * __thiscall testing::Message::operator<<(Message *this,wstring *wstr)

{
  char cVar1;
  long lVar2;
  long lVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  long lVar8;
  char local_49;
  Message *local_48;
  internal local_40;
  undefined7 uStack_3f;
  long local_38;
  
  lVar2 = *(long *)(wstr + 8);
  local_48 = this;
  if (lVar2 != 0) {
    lVar3 = *(long *)wstr;
    lVar8 = 0;
    do {
      if (*(int *)(lVar3 + lVar8 * 4) == 0) {
        pbVar4 = (local_48->ss_).ptr_;
        pbVar6 = pbVar4 + 0x10;
        if (pbVar4 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        local_40 = (internal)0x0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,(char *)&local_40,1);
        lVar8 = lVar8 + 1;
      }
      else {
        internal::WideStringToUtf8(&local_40,(wchar_t *)(lVar3 + lVar8 * 4),(int)lVar2 - (int)lVar8)
        ;
        pbVar4 = (local_48->ss_).ptr_;
        pbVar6 = pbVar4 + 0x10;
        if (pbVar4 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        lVar5 = CONCAT71(uStack_3f,local_40);
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,"(null)",6);
        }
        else if (local_38 != 0) {
          lVar7 = 0;
          do {
            cVar1 = *(char *)(lVar5 + lVar7);
            if (cVar1 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,"\\0",2);
            }
            else {
              local_49 = cVar1;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,&local_49,1);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != local_38);
        }
        lVar5 = lVar8;
        if ((void *)CONCAT71(uStack_3f,local_40) != (void *)0x0) {
          operator_delete__((void *)CONCAT71(uStack_3f,local_40));
        }
        for (; (lVar2 != lVar5 && (lVar8 = lVar5, *(int *)(lVar3 + lVar5 * 4) != 0));
            lVar5 = lVar5 + 1) {
          lVar8 = lVar2;
        }
      }
    } while (lVar8 != lVar2);
  }
  return local_48;
}

Assistant:

Message& Message::operator <<(const ::std::wstring& wstr) {
  internal::StreamWideCharsToMessage(wstr.c_str(), wstr.length(), this);
  return *this;
}